

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O0

XMLWriter * __thiscall kratos::XMLWriter::content(XMLWriter *this,string *var)

{
  string *var_local;
  XMLWriter *this_local;
  
  close_tag(this);
  write_escape(this,var);
  return this;
}

Assistant:

XMLWriter &content(const std::string &var) {
        close_tag();
        write_escape(var);
        return *this;
    }